

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dhm.c
# Opt level: O1

int dhm_read_bignum(mbedtls_mpi *X,uchar **p,uchar *end)

{
  ushort uVar1;
  int iVar2;
  uint uVar3;
  ushort *puVar4;
  
  puVar4 = (ushort *)*p;
  iVar2 = -0x3080;
  if (1 < (long)end - (long)puVar4) {
    uVar1 = *puVar4;
    puVar4 = puVar4 + 1;
    *p = (uchar *)puVar4;
    uVar3 = (uint)(ushort)(uVar1 << 8 | uVar1 >> 8);
    if ((int)uVar3 <= (int)end - (int)puVar4) {
      iVar2 = mbedtls_mpi_read_binary(X,(uchar *)puVar4,(ulong)uVar3);
      if (iVar2 == 0) {
        *p = *p + uVar3;
        iVar2 = 0;
      }
      else {
        iVar2 = iVar2 + -0x3100;
      }
    }
  }
  return iVar2;
}

Assistant:

static int dhm_read_bignum( mbedtls_mpi *X,
                            unsigned char **p,
                            const unsigned char *end )
{
    int ret, n;

    if( end - *p < 2 )
        return( MBEDTLS_ERR_DHM_BAD_INPUT_DATA );

    n = ( (*p)[0] << 8 ) | (*p)[1];
    (*p) += 2;

    if( (int)( end - *p ) < n )
        return( MBEDTLS_ERR_DHM_BAD_INPUT_DATA );

    if( ( ret = mbedtls_mpi_read_binary( X, *p, n ) ) != 0 )
        return( MBEDTLS_ERR_DHM_READ_PARAMS_FAILED + ret );

    (*p) += n;

    return( 0 );
}